

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_base64_encode_internal(char *target,char *data,int len,char *base64_encodes)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  char *pcVar10;
  int iVar11;
  
  iVar11 = len % 3;
  iVar5 = (len / 3 + 1) - (uint)(iVar11 == 0);
  lVar6 = (long)len;
  pcVar10 = target + (long)iVar5 * 4;
  *pcVar10 = '\0';
  if (iVar11 == 1) {
    uVar7 = (uint)data[lVar6 + -1];
    lVar6 = lVar6 + -2;
    pcVar10[-2] = '=';
    pcVar10[-1] = '=';
    uVar8 = (uVar7 & 3) << 4;
  }
  else {
    if (iVar11 != 2) {
      pcVar10 = target + (long)iVar5 * 4 + -1;
      lVar6 = lVar6 + -1;
      goto LAB_00134cb8;
    }
    cVar1 = data[lVar6 + -1];
    uVar7 = (uint)data[lVar6 + -2];
    lVar6 = lVar6 + -3;
    pcVar10[-1] = '=';
    pcVar10[-2] = base64_encodes[(ulong)((int)cVar1 & 0xf) * 4];
    uVar8 = (uint)(int)cVar1 >> 4 & 0xf | (uVar7 & 3) << 4;
  }
  pcVar10[-3] = base64_encodes[uVar8];
  pcVar10[-4] = base64_encodes[uVar7 >> 2 & 0x3f];
  pcVar10 = pcVar10 + -5;
LAB_00134cb8:
  pbVar9 = (byte *)(data + lVar6);
  for (lVar6 = 0; -(len / 3) != (int)lVar6; lVar6 = lVar6 + -1) {
    bVar2 = *pbVar9;
    bVar3 = pbVar9[-1];
    bVar4 = pbVar9[-2];
    pcVar10[lVar6 * 4] = base64_encodes[bVar2 & 0x3f];
    pcVar10[lVar6 * 4 + -1] = base64_encodes[(uint)(bVar2 >> 6) + ((int)(char)bVar3 & 0xfU) * 4];
    pcVar10[lVar6 * 4 + -2] =
         base64_encodes[(uint)(int)(char)bVar3 >> 4 & 0xf | ((int)(char)bVar4 & 3U) << 4];
    pcVar10[lVar6 * 4 + -3] = base64_encodes[(uint)(int)(char)bVar4 >> 2 & 0x3f];
    pbVar9 = pbVar9 + -3;
  }
  return iVar5 * 4;
}

Assistant:

static inline int fio_base64_encode_internal(char *target, const char *data,
                                             int len,
                                             const char *base64_encodes) {
  /* walk backwards, allowing fo inplace decoding (target == data) */
  int groups = len / 3;
  const int mod = len - (groups * 3);
  const int target_size = (groups + (mod != 0)) * 4;
  char *writer = target + target_size - 1;
  const char *reader = data + len - 1;
  writer[1] = 0;
  switch (mod) {
  case 2: {
    char tmp2 = *(reader--);
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = base64_encodes[((tmp2 & 15) << 2)];
    *(writer--) = base64_encodes[((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15)];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  case 1: {
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = '=';
    *(writer--) = base64_encodes[(tmp1 & 3) << 4];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  }
  while (groups) {
    groups--;
    const char tmp3 = *(reader--);
    const char tmp2 = *(reader--);
    const char tmp1 = *(reader--);
    *(writer--) = base64_encodes[tmp3 & 63];
    *(writer--) = base64_encodes[((tmp2 & 15) << 2) | ((tmp3 >> 6) & 3)];
    *(writer--) = base64_encodes[(((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15))];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  }
  return target_size;
}